

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::checkTransformFeedbackBuffer
          (CaptureVertexSeparate *this,BindBufferCase bind_case,GLenum primitive_type)

{
  long lVar1;
  float fVar2;
  long *plVar3;
  ulong uVar4;
  bool bVar5;
  deUint32 dVar6;
  long lVar7;
  long lVar8;
  undefined4 *puVar9;
  GLuint j;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  undefined4 in_register_00000034;
  GLint i;
  long lVar13;
  float *pfVar14;
  bool bVar15;
  
  plVar3 = *(long **)(*(long *)(&this->field_0x78 + (long)this->_vptr_CaptureVertexSeparate[-3]) + 8
                     );
  lVar7 = (**(code **)(*plVar3 + 0x18))(plVar3,CONCAT44(in_register_00000034,bind_case));
  if (6 < primitive_type) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  uVar4 = *(ulong *)(&DAT_0164b788 + (ulong)primitive_type * 8);
  bVar5 = true;
  for (lVar13 = 0; lVar8 = (long)(this->m_max_transform_feedback_separate_attribs + -1),
      lVar13 < lVar8; lVar13 = lVar13 + 1) {
    (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_buffers[lVar13]);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd0d);
    lVar8 = (**(code **)(lVar7 + 0xcf8))(0x8c8e,35000);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glMapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd10);
    uVar10 = 0;
    while ((uVar10 < uVar4 && (bVar5))) {
      lVar11 = 0;
      do {
        if (lVar11 == 4) goto LAB_009321a3;
        lVar1 = lVar11 * 4;
        uVar12 = (uint)lVar11;
        lVar11 = lVar11 + 1;
      } while (ABS(*(float *)(lVar8 + lVar1) - (float)(uVar12 | (int)lVar13 * 4)) <= 0.125);
      bVar5 = false;
LAB_009321a3:
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x10;
    }
    (**(code **)(lVar7 + 0x1670))(0x8c8e);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glUnmapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd23);
  }
  if (bVar5) {
    (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_buffers[lVar8]);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd2a);
    lVar13 = (**(code **)(lVar7 + 0xcf8))(0x8c8e,35000);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glMapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd2d);
    lVar8 = uVar4 + 1;
    pfVar14 = (float *)(lVar13 + 0xc);
    do {
      lVar8 = lVar8 + -1;
      bVar15 = bVar5;
      if (lVar8 == 0) goto LAB_009322fc;
      if (0.125 < ABS(ABS(pfVar14[-3]) + -1.0 + 0.0625)) break;
      bVar15 = false;
      if ((0.125 < ABS(ABS(pfVar14[-2]) + -1.0 + 0.0625)) ||
         (bVar15 = false, 0.125 < ABS(pfVar14[-1]))) goto LAB_009322fc;
      fVar2 = *pfVar14;
      pfVar14 = pfVar14 + 4;
    } while (ABS(fVar2 + -1.0) <= 0.125);
    bVar15 = false;
LAB_009322fc:
    (**(code **)(lVar7 + 0x1670))(0x8c8e);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glUnmapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd3e);
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexSeparate::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint number_of_vertices = 0;

	switch (primitive_type)
	{
	case GL_POINTS:
		number_of_vertices = 4;
		break;
	case GL_LINES:
		number_of_vertices = 4;
		break;
	case GL_LINE_LOOP:
		number_of_vertices = 8;
		break;
	case GL_LINE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLES:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_FAN:
		number_of_vertices = 6;
		break;
	default:
		throw 0;
	}

	bool is_ok = true;

	for (glw::GLint i = 0; i < m_max_transform_feedback_separate_attribs - 1; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffers[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

		for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
		{
			for (glw::GLuint k = 0; k < 4 /* vec4 */; ++k)
			{
				glw::GLfloat result	= results[j * 4 + k];
				glw::GLfloat reference = (glw::GLfloat)(i * 4 + k);

				if (fabs(result - reference) > 0.125 /* precision */)
				{
					is_ok = false;

					break;
				}
			}
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");
	}

	/* gl_Position */
	if (is_ok)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffers[m_max_transform_feedback_separate_attribs - 1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

		for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
		{
			glw::GLfloat result[4] = { results[j * 4], results[j * 4 + 1], results[j * 4 + 2], results[j * 4 + 3] };

			if ((fabs(fabs(result[0]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
				(fabs(fabs(result[1]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
				(fabs(result[2]) > 0.125 /* precision */) || (fabs(result[3] - 1.0) > 0.125 /* precision */))
			{
				is_ok = false;

				break;
			}
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");
	}

	return is_ok;
}